

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3CheckObjectName(Parse *pParse,char *zName)

{
  uchar uVar1;
  long lVar2;
  uchar uVar3;
  
  if (((((pParse->db->init).busy != '\0') || (pParse->nested != '\0')) || (zName == (char *)0x0)) ||
     (((uint)pParse->db->flags & 0x10000001) == 1)) {
    return 0;
  }
  lVar2 = 0;
  do {
    if ((ulong)(byte)zName[lVar2] == 0) {
      uVar1 = ""[(byte)"sqlite_"[lVar2]];
      uVar3 = '\0';
LAB_00170aa7:
      if (uVar3 != uVar1) {
        return 0;
      }
      break;
    }
    uVar3 = ""[(byte)zName[lVar2]];
    uVar1 = ""[(byte)"sqlite_"[lVar2]];
    if (uVar3 != uVar1) goto LAB_00170aa7;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  sqlite3ErrorMsg(pParse,"object name reserved for internal use: %s");
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3CheckObjectName(Parse *pParse, const char *zName){
  if( !pParse->db->init.busy && pParse->nested==0 
          && sqlite3WritableSchema(pParse->db)==0
          && 0==sqlite3StrNICmp(zName, "sqlite_", 7) ){
    sqlite3ErrorMsg(pParse, "object name reserved for internal use: %s", zName);
    return SQLITE_ERROR;
  }
  return SQLITE_OK;
}